

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Transform * phyr::Transform::scale(Transform *__return_storage_ptr__,double sx,double sy,double sz)

{
  (__return_storage_ptr__->mat).d[0][0] = sx;
  (__return_storage_ptr__->mat).d[0][1] = 0.0;
  (__return_storage_ptr__->mat).d[0][2] = 0.0;
  (__return_storage_ptr__->mat).d[0][3] = 0.0;
  (__return_storage_ptr__->mat).d[1][0] = 0.0;
  (__return_storage_ptr__->mat).d[1][1] = sy;
  (__return_storage_ptr__->mat).d[1][2] = 0.0;
  (__return_storage_ptr__->mat).d[1][3] = 0.0;
  (__return_storage_ptr__->mat).d[2][0] = 0.0;
  (__return_storage_ptr__->mat).d[2][1] = 0.0;
  (__return_storage_ptr__->mat).d[2][2] = sz;
  (__return_storage_ptr__->mat).d[2][3] = 0.0;
  (__return_storage_ptr__->mat).d[3][0] = 0.0;
  (__return_storage_ptr__->mat).d[3][1] = 0.0;
  (__return_storage_ptr__->mat).d[3][2] = 0.0;
  (__return_storage_ptr__->mat).d[3][3] = 1.0;
  (__return_storage_ptr__->invMat).d[0][0] = 1.0 / sx;
  (__return_storage_ptr__->invMat).d[0][1] = 0.0;
  (__return_storage_ptr__->invMat).d[0][2] = 0.0;
  (__return_storage_ptr__->invMat).d[0][3] = 0.0;
  (__return_storage_ptr__->invMat).d[1][0] = 0.0;
  (__return_storage_ptr__->invMat).d[1][1] = 1.0 / sy;
  (__return_storage_ptr__->invMat).d[1][2] = 0.0;
  (__return_storage_ptr__->invMat).d[1][3] = 0.0;
  (__return_storage_ptr__->invMat).d[2][0] = 0.0;
  (__return_storage_ptr__->invMat).d[2][1] = 0.0;
  (__return_storage_ptr__->invMat).d[2][2] = 1.0 / sz;
  (__return_storage_ptr__->invMat).d[3][1] = 0.0;
  (__return_storage_ptr__->invMat).d[3][2] = 0.0;
  (__return_storage_ptr__->invMat).d[2][3] = 0.0;
  (__return_storage_ptr__->invMat).d[3][0] = 0.0;
  (__return_storage_ptr__->invMat).d[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Transform Transform::scale(Real sx, Real sy, Real sz) {
    Mat4x4 m = Mat4x4(sx,  0,  0, 0,
                       0, sy,  0, 0,
                       0,  0, sz, 0,
                       0,  0,  0, 1);
    Mat4x4 mi = Mat4x4(1 / sx,      0,      0, 0,
                            0, 1 / sy,      0, 0,
                            0,      0, 1 / sz, 0,
                            0,      0,      0, 1);
    return Transform(m, mi);
}